

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::Mutex::LockSlowLoop(Mutex *this,SynchWaitParams *waitp,int flags)

{
  ulong uVar1;
  long *plVar2;
  MuHow pMVar3;
  long lVar4;
  Condition *pCVar5;
  int c;
  PerThreadSynch *pPVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 4);
  }
  if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
     (waitp->thread->suppress_fatal_errors == false)) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x7d6,"Check %s failed: %s",
               "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
               "detected illegal recursion into Mutex code");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x7d6,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
  }
  c = 0;
  do {
    uVar8 = (this->mu_).super___atomic_base<long>._M_i;
    CheckForMutexCorruption(uVar8,"Lock");
    pMVar3 = waitp->how;
    if ((pMVar3->slow_need_zero & uVar8) == 0) {
      LOCK();
      bVar9 = uVar8 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar9) {
        (this->mu_).super___atomic_base<long>._M_i =
             ((-(ulong)((flags & 1U) == 0) | 0xfffffffffffffffd) & uVar8 | pMVar3->fast_or) +
             pMVar3->fast_add;
      }
      UNLOCK();
      if (bVar9) {
LAB_002d126c:
        pCVar5 = waitp->cond;
        if ((pCVar5 == (Condition *)0x0) || (bVar9 = (*pCVar5->eval_)(pCVar5), bVar9)) {
          if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
             (waitp->thread->suppress_fatal_errors == false)) {
            raw_log_internal::RawLog
                      (kFatal,"mutex.cc",0x83d,"Check %s failed: %s",
                       "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
                       "detected illegal recursion into Mutex code");
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                          ,0x83d,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
          }
          if ((uVar8 & 0x10) != 0) {
            PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 5);
            return;
          }
          return;
        }
        UnlockSlow(this,waitp);
LAB_002d1287:
        Block(this,waitp->thread);
        flags = flags | 1;
        c = 0;
      }
    }
    else if ((uVar8 & 0x44) == 0) {
      pPVar6 = Enqueue((PerThreadSynch *)0x0,waitp,uVar8,flags);
      if (pPVar6 == (PerThreadSynch *)0x0) {
        raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x7f3,"Check %s failed: %s","new_h != nullptr",
                   "Enqueue to empty list failed");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x7f3,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
      }
      uVar7 = (ulong)((uint)uVar8 & (uint)((flags & 1U) == 0) * 2 + 0xb9);
      uVar1 = uVar7 + 4;
      uVar7 = uVar7 | 0x24;
      if ((uVar8 & 1) == 0) {
        uVar7 = uVar1;
      }
      if (waitp->how != (MuHow)kExclusiveS) {
        uVar7 = uVar1;
      }
      LOCK();
      bVar9 = uVar8 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar9) {
        (this->mu_).super___atomic_base<long>._M_i = uVar7 | (ulong)pPVar6;
      }
      UNLOCK();
      if (bVar9) goto LAB_002d1287;
      waitp->thread->waitp = (SynchWaitParams *)0x0;
    }
    else if (((-(ulong)((flags & 1U) == 0) | 0xffffffffffffffdf) & pMVar3->slow_inc_need_zero &
             uVar8) == 0) {
      LOCK();
      bVar9 = uVar8 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar9) {
        (this->mu_).super___atomic_base<long>._M_i =
             ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffbc) & uVar8 | 0x41;
      }
      UNLOCK();
      if (bVar9) {
        plVar2 = (long *)((uVar8 & 0xffffffffffffff00) + 0x28);
        *plVar2 = *plVar2 + 0x100;
        do {
          uVar8 = (this->mu_).super___atomic_base<long>._M_i;
          LOCK();
          bVar9 = uVar8 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar9) {
            (this->mu_).super___atomic_base<long>._M_i = (uVar8 & 0xffffffffffffffbe) + 1;
          }
          UNLOCK();
        } while (!bVar9);
        goto LAB_002d126c;
      }
    }
    else if ((uVar8 & 0x40) == 0) {
      LOCK();
      bVar9 = uVar8 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar9) {
        (this->mu_).super___atomic_base<long>._M_i =
             ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffb9) & uVar8 | 0x44;
      }
      UNLOCK();
      if (bVar9) {
        pPVar6 = Enqueue((PerThreadSynch *)(uVar8 & 0xffffffffffffff00),waitp,uVar8,flags);
        if (pPVar6 == (PerThreadSynch *)0x0) {
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x822,"Check %s failed: %s","new_h != nullptr",
                     "Enqueue to list failed");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x822,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
        }
        uVar8 = (ulong)(((uint)uVar8 & 1) << 5);
        if (waitp->how != (MuHow)kExclusiveS) {
          uVar8 = 0;
        }
        do {
          lVar4 = (this->mu_).super___atomic_base<long>._M_i;
          LOCK();
          bVar9 = lVar4 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar9) {
            (this->mu_).super___atomic_base<long>._M_i =
                 (ulong)((uint)lVar4 & 0xbb) | uVar8 | (ulong)pPVar6 | 4;
          }
          UNLOCK();
        } while (!bVar9);
        goto LAB_002d1287;
      }
    }
    if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
       (waitp->thread->suppress_fatal_errors == false)) {
      raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x837,"Check %s failed: %s",
                 "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
                 "detected illegal recursion into Mutex code");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x837,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
    }
    c = synchronization_internal::MutexDelay(c,1);
  } while( true );
}

Assistant:

void Mutex::LockSlowLoop(SynchWaitParams* waitp, int flags) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, waitp->how == kExclusive ? SYNCH_EV_LOCK : SYNCH_EV_READERLOCK);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    CheckForMutexCorruption(v, "Lock");
    if ((v & waitp->how->slow_need_zero) == 0) {
      if (mu_.compare_exchange_strong(
              v,
              (waitp->how->fast_or |
               (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
                  waitp->how->fast_add,
              std::memory_order_acquire, std::memory_order_relaxed)) {
        if (waitp->cond == nullptr ||
            EvalConditionAnnotated(waitp->cond, this, true, false,
                                   waitp->how == kShared)) {
          break;  // we timed out, or condition true, so return
        }
        this->UnlockSlow(waitp);  // got lock but condition false
        this->Block(waitp->thread);
        flags |= kMuHasBlocked;
        c = 0;
      }
    } else {  // need to access waiter list
      bool dowait = false;
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h = Enqueue(nullptr, waitp, v, flags);
        intptr_t nv =
            (v & ClearDesignatedWakerMask(flags & kMuHasBlocked) & kMuLow) |
            kMuWait;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to empty list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          nv |= kMuWrWait;
        }
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | nv,
                std::memory_order_release, std::memory_order_relaxed)) {
          dowait = true;
        } else {  // attempted Enqueue() failed
          // zero out the waitp field set by Enqueue()
          waitp->thread->waitp = nullptr;
        }
      } else if ((v & waitp->how->slow_inc_need_zero &
                  IgnoreWaitingWritersMask(flags & kMuHasBlocked)) == 0) {
        // This is a reader that needs to increment the reader count,
        // but the count is currently held in the last waiter.
        if (mu_.compare_exchange_strong(
                v,
                (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                    kMuSpin | kMuReader,
                std::memory_order_acquire, std::memory_order_relaxed)) {
          PerThreadSynch* h = GetPerThreadSynch(v);
          h->readers += kMuOne;  // inc reader count in waiter
          do {                   // release spinlock
            v = mu_.load(std::memory_order_relaxed);
          } while (!mu_.compare_exchange_weak(v, (v & ~kMuSpin) | kMuReader,
                                              std::memory_order_release,
                                              std::memory_order_relaxed));
          if (waitp->cond == nullptr ||
              EvalConditionAnnotated(waitp->cond, this, true, false,
                                     waitp->how == kShared)) {
            break;  // we timed out, or condition true, so return
          }
          this->UnlockSlow(waitp);  // got lock but condition false
          this->Block(waitp->thread);
          flags |= kMuHasBlocked;
          c = 0;
        }
      } else if ((v & kMuSpin) == 0 &&  // attempt to queue ourselves
                 mu_.compare_exchange_strong(
                     v,
                     (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                         kMuSpin | kMuWait,
                     std::memory_order_acquire, std::memory_order_relaxed)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, waitp, v, flags);
        intptr_t wr_wait = 0;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          wr_wait = kMuWrWait;  // give priority to a waiting writer
        }
        do {  // release spinlock
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & (kMuLow & ~kMuSpin)) | kMuWait | wr_wait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        dowait = true;
      }
      if (dowait) {
        this->Block(waitp->thread);  // wait until removed from list or timeout
        flags |= kMuHasBlocked;
        c = 0;
      }
    }
    ABSL_RAW_CHECK(
        waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
        "detected illegal recursion into Mutex code");
    // delay, then try again
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this, waitp->how == kExclusive
                             ? SYNCH_EV_LOCK_RETURNING
                             : SYNCH_EV_READERLOCK_RETURNING);
  }
}